

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap_unittest.cc
# Opt level: O3

void __thiscall AddressMapUnittest_Basic_Test::TestBody(AddressMapUnittest_Basic_Test *this)

{
  _Head_base<0UL,_char_*,_false> _Var1;
  Object *pOVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  internal iVar4;
  char cVar5;
  bool bVar6;
  size_t __i;
  long lVar7;
  result_type rVar8;
  pair<int,_unsigned_long> *ppVar9;
  ulong uVar10;
  ulong uVar11;
  Number num;
  long *plVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Object *pOVar14;
  ValueT *pVVar15;
  char *pcVar16;
  char *in_R9;
  int iVar17;
  pointer *__ptr;
  uint uVar18;
  Number num_6;
  ulong uVar19;
  pair<int,_unsigned_long> value;
  pair<int,_unsigned_long> value_00;
  pair<int,_unsigned_long> value_01;
  pair<int,_unsigned_long> value_02;
  pair<std::_Rb_tree_iterator<std::pair<const_void_*,_int>_>,_std::_Rb_tree_iterator<std::pair<const_void_*,_int>_>_>
  pVar20;
  FunctionRef<void_(const_void_*,_std::pair<int,_unsigned_long>_*)> body;
  undefined1 local_14a0 [8];
  mt19937 rng;
  int local_10c;
  undefined1 auStack_108 [4];
  int N;
  vector<PtrAndSize,_std::allocator<PtrAndSize>_> ptrs_and_sizes;
  Object *local_e8;
  size_t s;
  code *local_d8;
  code *local_d0;
  Object *local_c8;
  Key local_c0;
  void *res_p;
  int local_ac;
  ulong local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  char *p;
  undefined1 local_90 [8];
  set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
  check_set;
  ValueT removed;
  AssertHelper local_40;
  AssertHelper local_38;
  
  local_10c = 100000;
  local_14a0 = (undefined1  [8])0x0;
  lVar7 = 1;
  uVar10 = 0;
  do {
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar7);
    rng._M_x[lVar7 + -1] = uVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  rng._M_x[0x26f] = 0x270;
  _auStack_108 = (PtrAndSize *)0x0;
  ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::reserve
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)auStack_108,100000);
  iVar17 = 100000;
  do {
    local_90 = (undefined1  [8])0x0;
    check_set._M_t._M_impl._0_8_ = 0x2f;
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_90,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_14a0,(param_type *)local_90);
    local_e8 = (Object *)(rVar8 + 1);
    local_90 = (undefined1  [8])operator_new__((ulong)local_e8);
    std::vector<PtrAndSize,std::allocator<PtrAndSize>>::emplace_back<char*,unsigned_long&>
              ((vector<PtrAndSize,std::allocator<PtrAndSize>> *)auStack_108,(char **)local_90,
               (unsigned_long *)&stack0xffffffffffffff18);
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  pVVar15 = &removed;
  uVar10 = 0;
LAB_00108773:
  printf("Iteration %d/%d...\n",uVar10,0x14);
  std::
  shuffle<__gnu_cxx::__normal_iterator<PtrAndSize*,std::vector<PtrAndSize,std::allocator<PtrAndSize>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (_auStack_108,
             (__normal_iterator<PtrAndSize_*,_std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>_>
             )ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
              super__Vector_impl_data._M_start,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_14a0);
  s = 0;
  local_d8 = malloc;
  local_d0 = free;
  local_c8 = (Object *)calloc(1,0x8008);
  local_e8 = local_c8 + 1;
  local_ac = 0;
  do {
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _auStack_108[local_ac].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>.
         _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    plVar12 = (long *)((long)&local_e8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00108856;
    } while (plVar12[1] != (ulong)local_a0._M_head_impl >> 0x14);
    plVar12 = (long *)((long)plVar12 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    while (plVar12 = (long *)*plVar12, plVar12 != (long *)0x0) {
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar12[1] ==
          local_a0._M_head_impl) {
        check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
             check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffffffffff00;
        removed.first = 0;
        removed._4_4_ = 0;
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_90,
                   (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (AssertionResult *)0x13912a,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x5d,(char *)local_90);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_001096ee;
      }
    }
LAB_00108856:
    check_set._M_t._M_impl._0_8_ = _auStack_108[local_ac].size - 1;
    local_90 = (undefined1  [8])0x0;
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_90,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_14a0,(param_type *)local_90);
    ppVar9 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                       ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
                        SizeFunc,0x6400000,local_a0._M_head_impl + (int)rVar8,&local_c0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  ppVar9 == (pair<int,_unsigned_long> *)0x0);
    removed.first = 0;
    removed._4_4_ = 0;
    if (ppVar9 != (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)0x1391cb,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x5f,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_001096ee;
    }
    value._0_8_ = (long)local_ac;
    value.second = _auStack_108[value._0_8_].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
               local_a0._M_head_impl,value);
    plVar12 = (long *)((long)&local_e8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_001095af;
    } while (plVar12[1] != (ulong)local_a0._M_head_impl >> 0x14);
    plVar12 = (long *)((long)plVar12 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_001095af;
    } while ((_Base_ptr)plVar12[1] != (_Base_ptr)local_a0._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i",(int *)(plVar12 + 2),&local_ac);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x62,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    ppVar9 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                       ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
                        SizeFunc,0x31,local_a0._M_head_impl + (int)rVar8,&local_c0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  ppVar9 != (pair<int,_unsigned_long> *)0x0);
    removed.first = 0;
    removed._4_4_ = 0;
    if (ppVar9 == (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)
                 "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,99,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_001096ee;
    }
    testing::internal::CmpHelperEQ<void_const*,char*>
              ((internal *)local_90,"res_p","p",&local_c0,(char **)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,100,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i",&ppVar9->first,&local_ac);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x65,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    value_00.first = local_ac + 100000;
    value_00._4_4_ = 0;
    value_00.second = _auStack_108[local_ac].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
               local_a0._M_head_impl,value_00);
    plVar12 = (long *)((long)&local_e8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00109686;
    } while (plVar12[1] != (ulong)local_a0._M_head_impl >> 0x14);
    plVar12 = (long *)((long)plVar12 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00109686;
    } while ((_Base_ptr)plVar12[1] != (_Base_ptr)local_a0._M_head_impl);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,local_ac + 100000
                 );
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + N",(int *)(plVar12 + 2),
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_a8 = CONCAT71(local_a8._1_7_,local_90[0]);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcVar16 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x68,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar14 = local_c8;
    if ((char)local_a8 == '\0') goto LAB_00109738;
    iVar17 = local_ac + 1;
    bVar6 = local_ac < 99999;
    local_ac = iVar17;
  } while (bVar6);
  uVar19 = 0xfffffffffffffffe;
  uVar11 = 0;
  do {
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff00000000;
    removed.first = 0;
    removed._4_4_ = 0;
    local_a8 = uVar11;
    bVar6 = AddressMap<std::pair<int,_unsigned_long>_>::FindAndRemove
                      ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
                       *(Key *)((long)&(_auStack_108->ptr)._M_t.
                                       super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
                                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
                                       super__Head_base<0UL,_char_*,_false>._M_head_impl + uVar11),
                       (pair<int,_unsigned_long> *)
                       &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    _Var3._M_head_impl = local_a0._M_head_impl;
    local_a0._M_head_impl._0_1_ = bVar6;
    p = (char *)0x0;
    if (!bVar6) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)&local_a0,
                 (AssertionResult *)"map.FindAndRemove(p, &removed)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x6f,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_90 != (undefined1  [8])&check_set._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_90,
                        check_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
      }
      pOVar14 = local_c8;
      if (p == (char *)0x0) goto LAB_00109738;
      pVVar15 = (ValueT *)&p;
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p;
      goto LAB_0010972c;
    }
    local_a0._M_head_impl._4_4_ = SUB84(_Var3._M_head_impl,4);
    local_a0._M_head_impl._0_4_ = (int)uVar19 + 0x186a2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"removed.first","i + N",
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,(int *)&local_a0);
    res_p = (void *)CONCAT71(res_p._1_7_,local_90[0]);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a0);
      pcVar16 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x70,pcVar16);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar14 = local_c8;
    if ((char)res_p == '\0') goto LAB_00109738;
    uVar19 = uVar19 + 2;
    uVar11 = local_a8 + 0x20;
  } while (uVar19 < 0x1869e);
  uVar11 = 1;
  do {
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _auStack_108[uVar11].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    plVar12 = (long *)((long)&local_e8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_001099c5;
    } while (plVar12[1] != (ulong)local_a0._M_head_impl >> 0x14);
    plVar12 = (long *)((long)plVar12 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_001099c5;
    } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar12[1]
             != local_a0._M_head_impl);
    iVar17 = (int)uVar11 + 100000;
    res_p = (void *)CONCAT44(res_p._4_4_,iVar17);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,iVar17);
    local_a8 = uVar11;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + N",(int *)(plVar12 + 2),
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x77,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    check_set._M_t._M_impl._0_8_ = _auStack_108[uVar11].size - 1;
    local_90 = (undefined1  [8])0x0;
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_90,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_14a0,(param_type *)local_90);
    rng._M_p = (size_t)AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                                 ((AddressMap<std::pair<int,_unsigned_long>_> *)
                                  &stack0xffffffffffffff18,SizeFunc,0x31,
                                  local_a0._M_head_impl + (int)rVar8,&local_c0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  (pair<int,_unsigned_long> *)rng._M_p != (pair<int,_unsigned_long> *)0x0);
    removed.first = 0;
    removed._4_4_ = 0;
    if ((pair<int,_unsigned_long> *)rng._M_p == (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)
                 "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x79,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_90 != (undefined1  [8])&check_set._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_90,
                        check_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
      }
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)removed._0_8_;
      pOVar14 = local_c8;
      if (removed._0_8_ != 0) goto LAB_0010972c;
      goto LAB_00109738;
    }
    testing::internal::CmpHelperEQ<void_const*,char*>
              ((internal *)local_90,"res_p","p",&local_c0,(char **)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7a,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,res_p._0_4_);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + N",(int *)rng._M_p,
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7b,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    uVar18 = (int)local_a8 + 200000;
    value_01._4_4_ = 0;
    value_01.first = uVar18;
    value_01.second = _auStack_108[uVar11].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
               local_a0._M_head_impl,value_01);
    plVar12 = (long *)((long)&local_e8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00109a32;
    } while (plVar12[1] != (ulong)local_a0._M_head_impl >> 0x14);
    plVar12 = (long *)((long)plVar12 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00109a32;
    } while ((_Base_ptr)plVar12[1] != (_Base_ptr)local_a0._M_head_impl);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,uVar18);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + 2*N",(int *)(plVar12 + 2),
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar4 = local_90[0];
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcVar16 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x7e,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar14 = local_c8;
    if (iVar4 == (internal)0x0) goto LAB_00109738;
    uVar11 = local_a8 + 2;
  } while (local_a8 < 0x1869e);
  local_a8 = 0;
  while( true ) {
    uVar11 = local_a8;
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _auStack_108[local_a8].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>.
         _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    check_set._M_t._M_impl._0_8_ = _auStack_108[local_a8].size - 1;
    local_90 = (undefined1  [8])0x0;
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_90,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_14a0,(param_type *)local_90);
    res_p = (void *)(long)(int)rVar8;
    ppVar9 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                       ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
                        SizeFunc,0x6400000,local_a0._M_head_impl + (long)res_p,&local_c0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  ppVar9 == (pair<int,_unsigned_long> *)0x0);
    removed.first = 0;
    removed._4_4_ = 0;
    if (ppVar9 != (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)"!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x85,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_001096ee;
    }
    value_02.first = (int)local_a8 + 200000;
    value_02._4_4_ = 0;
    value_02.second = _auStack_108[uVar11].size;
    AddressMap<std::pair<int,_unsigned_long>_>::Insert
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
               local_a0._M_head_impl,value_02);
    plVar12 = (long *)((long)&local_e8->next +
                      (ulong)((uint)((int)((ulong)local_a0._M_head_impl >> 0x14) * -0x61c88647) >>
                              0x11 & 0xfffffff8));
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00109c26;
    } while (plVar12[1] != (ulong)local_a0._M_head_impl >> 0x14);
    plVar12 = (long *)((long)plVar12 +
                      (ulong)((uint)((ulong)local_a0._M_head_impl >> 4) & 0xfff8) + 0x10);
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == (long *)0x0) goto LAB_00109c26;
    } while ((_Base_ptr)plVar12[1] != (_Base_ptr)local_a0._M_head_impl);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,value_02.first);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + 2*N",(int *)(plVar12 + 2),
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_90[0] == (internal)0x0) break;
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    res_p = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                      ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,
                       SizeFunc,0x31,(long)res_p + local_a0._M_head_impl,&local_c0);
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT71(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                  (pair<int,_unsigned_long> *)res_p != (pair<int,_unsigned_long> *)0x0);
    removed.first = 0;
    removed._4_4_ = 0;
    if ((pair<int,_unsigned_long> *)res_p == (pair<int,_unsigned_long> *)0x0) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,
                 (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AssertionResult *)
                 "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x89,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      goto LAB_001096ee;
    }
    testing::internal::CmpHelperEQ<void_const*,char*>
              ((internal *)local_90,"res_p","p",&local_c0,(char **)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (check_set._M_t._M_impl._0_8_ == 0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x8a,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_001098eb;
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(check_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,value_02.first);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"result->first","i + 2*N",(int *)res_p,
               (int *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar4 = local_90[0];
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcVar16 = "";
      if (check_set._M_t._M_impl._0_8_ != 0) {
        pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x8b,pcVar16);
      testing::internal::AssertHelper::operator=
                (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
      }
    }
    if (check_set._M_t._M_impl._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&check_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   check_set._M_t._M_impl._0_8_);
    }
    pOVar14 = local_c8;
    if (iVar4 == (internal)0x0) goto LAB_00109738;
    uVar11 = local_a8 + 2;
    bVar6 = 0x1869d < local_a8;
    local_a8 = uVar11;
    if (bVar6) goto code_r0x00109299;
  }
  testing::Message::Message((Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (check_set._M_t._M_impl._0_8_ == 0) {
    pcVar16 = "";
  }
  else {
    pcVar16 = *(char **)check_set._M_t._M_impl._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x88,pcVar16);
  testing::internal::AssertHelper::operator=
            (&local_38,(Message *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_001098eb:
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    (**(code **)(*(long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
  }
  pOVar14 = local_c8;
  if (check_set._M_t._M_impl._0_8_ != 0) {
    pVVar15 = (ValueT *)&check_set;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              check_set._M_t._M_impl._0_8_;
    goto LAB_0010972c;
  }
  goto LAB_00109738;
LAB_001095af:
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffffffffff00;
  removed.first = 0;
  removed._4_4_ = 0;
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,
             (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x61,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
  goto LAB_001096ee;
LAB_00109686:
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffffffffff00;
  removed.first = 0;
  removed._4_4_ = 0;
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,
             (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x67,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
  goto LAB_001096ee;
LAB_001099c5:
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffffffffff00;
  removed.first = 0;
  removed._4_4_ = 0;
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,
             (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x76,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
  goto LAB_001096ee;
LAB_00109a32:
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffffffffff00;
  removed.first = 0;
  removed._4_4_ = 0;
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,
             (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x7d,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
  goto LAB_001096ee;
LAB_00109c26:
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       check_set._M_t._M_impl.super__Rb_tree_header._M_node_count & 0xffffffffffffff00;
  removed.first = 0;
  removed._4_4_ = 0;
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,
             (internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x87,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
LAB_001096ee:
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_90 != (undefined1  [8])&check_set._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)local_90,
                    check_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
  }
  pOVar14 = local_c8;
  if (removed._0_8_ != 0) {
    pVVar15 = &removed;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)removed._0_8_;
LAB_0010972c:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pVVar15,pbVar13);
    pOVar14 = local_c8;
  }
LAB_00109738:
  while (pOVar14 != (Object *)0x0) {
    pOVar2 = pOVar14->next;
    (*local_d0)(pOVar14);
    pOVar14 = pOVar2;
  }
  goto LAB_00109591;
LAB_00109d91:
  local_a0._M_head_impl = local_a0._M_head_impl & 0xffffffffffffff00;
  p = (char *)0x0;
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (internal *)&local_a0,(AssertionResult *)"result = map.Find(p)","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x97,(char *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if ((unsigned_long *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != &removed.second
     ) {
    operator_delete((void *)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    removed.second + 1);
  }
  if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
  }
  if (p != (char *)0x0) {
    pVVar15 = (ValueT *)&p;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p;
LAB_00109e40:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pVVar15,pbVar13);
  }
  goto LAB_00109e45;
code_r0x00109299:
  check_set._M_t._M_impl._0_8_ = check_set._M_t._M_impl._0_8_ & 0xffffffff00000000;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&check_set;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  body.data = &check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  body.fn = tcmalloc::FunctionRef<void(void_const*,std::pair<int,unsigned_long>*)>::
            FunctionRef<AddressMapUnittest_Basic_Test::TestBody()::$_0,void>(AddressMapUnittest_Basic_Test::TestBody()::$_0_const&)
            ::{lambda(void_const*,std::pair<int,unsigned_long>*,void*)#1}::
            pair<int,unsigned_long>__void__;
  check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  check_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_90;
  AddressMap<std::pair<int,_unsigned_long>_>::Iterate
            ((AddressMap<std::pair<int,_unsigned_long>_> *)&stack0xffffffffffffff18,body);
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "check_set.size()","N",(unsigned_long *)&local_a0,&local_10c);
  if ((char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count != '\0') {
    if (removed._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&removed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   removed._0_8_);
    }
    local_a8 = 0;
    do {
      _Var1._M_head_impl =
           _auStack_108[local_a8].ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char>_>.
           _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      iVar17 = (int)local_a8 + 200000;
      res_p = (void *)CONCAT44(res_p._4_4_,iVar17);
      removed.first = iVar17;
      check_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)_Var1._M_head_impl;
      pVar20 = std::
               _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
               ::equal_range((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                              *)local_90,
                             (key_type *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
      std::
      _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
      ::_M_erase_aux((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                      *)local_90,(_Base_ptr)pVar20.first._M_node,(_Base_ptr)pVar20.second._M_node);
      plVar12 = (long *)((long)&local_e8->next +
                        (ulong)((uint)((int)((ulong)_Var1._M_head_impl >> 0x14) * -0x61c88647) >>
                                0x11 & 0xfffffff8));
      do {
        plVar12 = (long *)*plVar12;
        if (plVar12 == (long *)0x0) goto LAB_00109d91;
      } while (plVar12[1] != (ulong)_Var1._M_head_impl >> 0x14);
      plVar12 = (long *)((long)plVar12 +
                        (ulong)((uint)((ulong)_Var1._M_head_impl >> 4) & 0xfff8) + 0x10);
      do {
        plVar12 = (long *)*plVar12;
        if (plVar12 == (long *)0x0) goto LAB_00109d91;
      } while ((char *)plVar12[1] != _Var1._M_head_impl);
      local_a0._M_head_impl._0_4_ = res_p._0_4_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 "result->first","i + 2*N",(int *)(plVar12 + 2),(int *)&local_a0);
      cVar5 = (char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count == '\0') {
        testing::Message::Message((Message *)&local_a0);
        pcVar16 = "";
        if (removed._0_8_ != 0) {
          pcVar16 = *(char **)removed._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x98,pcVar16);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      if (removed._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&removed,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     removed._0_8_);
      }
      if (cVar5 == '\0') goto LAB_00109e45;
      local_a8 = local_a8 + 1;
    } while (local_a8 != 100000);
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         check_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_38.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "check_set.size()","0",(unsigned_long *)&local_a0,(int *)&local_38);
    local_a8 = CONCAT71(local_a8._1_7_,
                        (char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((char)check_set._M_t._M_impl.super__Rb_tree_header._M_node_count == '\0') {
      testing::Message::Message((Message *)&local_a0);
      pcVar16 = "";
      if (removed._0_8_ != 0) {
        pcVar16 = *(char **)removed._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x9a,pcVar16);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    if (removed._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&removed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   removed._0_8_);
    }
    std::
    _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                 *)local_90);
    pOVar14 = local_c8;
    while (pOVar14 != (Object *)0x0) {
      pOVar2 = pOVar14->next;
      (*local_d0)(pOVar14);
      pOVar14 = pOVar2;
    }
    if (((char)local_a8 == '\0') ||
       (uVar18 = (int)uVar10 + 1, uVar10 = (ulong)uVar18, uVar18 == 0x14)) goto LAB_00109591;
    goto LAB_00108773;
  }
  testing::Message::Message((Message *)&local_a0);
  if (removed._0_8_ == 0) {
    pcVar16 = "";
  }
  else {
    pcVar16 = *(char **)removed._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
             ,0x93,pcVar16);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((_Base_ptr)local_a0._M_head_impl != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_a0._M_head_impl + 8))();
  }
  if (removed._0_8_ != 0) {
    pVVar15 = &removed;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)removed._0_8_;
    goto LAB_00109e40;
  }
LAB_00109e45:
  std::
  _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
               *)local_90);
  pOVar14 = local_c8;
  while (pOVar14 != (Object *)0x0) {
    pOVar2 = pOVar14->next;
    (*local_d0)(pOVar14);
    pOVar14 = pOVar2;
  }
LAB_00109591:
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::~vector
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)auStack_108);
  return;
}

Assistant:

TEST(AddressMapUnittest, Basic) {
  constexpr int N = 100000;
  constexpr int kIters = 20;
  constexpr int kMaxRealSize = 49;
  // 100Mb to stress not finding previous object (AddressMap's cluster is 1Mb):
  constexpr size_t kMaxSize = 100 << 20;

  std::mt19937 rng(0);

  // generates uniformly distributed size_t in range [0, n)
  auto uniform = [&] (size_t n) -> size_t {
    return std::uniform_int_distribution<size_t>{0, n-1}(rng);
  };

  std::vector<PtrAndSize> ptrs_and_sizes;
  ptrs_and_sizes.reserve(N);
  for (int i = 0; i < N; ++i) {
    size_t s = uniform(kMaxRealSize-1) + 1;
    ptrs_and_sizes.emplace_back(new char[s], s);
  }

  for (int x = 0; x < kIters; ++x) {
    printf("Iteration %d/%d...\n", x, kIters);

    // Permute pointers to get rid of allocation order issues
    std::shuffle(ptrs_and_sizes.begin(), ptrs_and_sizes.end(), rng);

    AddressMap<ValueT> map(malloc, free);
    const ValueT* result;
    const void* res_p;

    // Insert a bunch of entries
    for (int i = 0; i < N; ++i) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_FALSE(map.Find(p));
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_FALSE(map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i);
      map.Insert(p, std::make_pair(i + N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
    }

    // Delete the even entries
    for (int i = 0; i < N; i += 2) {
      void* p = ptrs_and_sizes[i].ptr.get();
      ValueT removed;
      ASSERT_TRUE(map.FindAndRemove(p, &removed));
      ASSERT_EQ(removed.first, i + N);
    }

    // Lookup the odd entries and adjust them
    for (int i = 1; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + N);
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Insert even entries back
    for (int i = 0; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Check all entries
    std::set<std::pair<const void*, int> > check_set;
    map.Iterate([&] (const void* ptr, ValueT* val) {
      check_set.insert(std::make_pair(ptr, val->first));
    });
    ASSERT_EQ(check_set.size(), N);
    for (int i = 0; i < N; ++i) {
      void* p = ptrs_and_sizes[i].ptr.get();
      check_set.erase(std::make_pair(p, i + 2*N));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }
    ASSERT_EQ(check_set.size(), 0);
  }
}